

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalAsOfJoin::GetData
          (PhysicalAsOfJoin *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  __pthread_list_t *p_Var1;
  __pthread_internal_list **pp_Var2;
  unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true> *this_00;
  HashGroupPtr *this_01;
  vector<duckdb::InterruptState,_true> *pvVar3;
  AsOfProbeBuffer *this_02;
  GlobalSourceState *pGVar4;
  AsOfLocalSourceState *this_03;
  _func_int **pp_Var5;
  ClientContext *context_00;
  _func_int *p_Var6;
  _func_int *p_Var7;
  _Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_> __ptr;
  _Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  __ptr_00;
  idx_t iVar8;
  bool *pbVar9;
  pointer pLVar10;
  pointer pLVar11;
  bool bVar12;
  type pPVar13;
  pointer this_04;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar14;
  Allocator *allocator;
  pointer pPVar15;
  pointer pRVar16;
  reference pvVar17;
  const_reference pvVar18;
  reference pvVar19;
  const_reference pvVar20;
  reference other;
  idx_t iVar21;
  long lVar22;
  SourceResultType SVar23;
  ExecutionContext *pEVar24;
  ExecutionContext *context_01;
  idx_t count;
  size_type __n;
  pointer __n_00;
  size_type sVar25;
  SelectionVector rsel;
  DataChunk rhs_chunk;
  SelectionVector local_88;
  DataChunk local_70;
  
  pGVar4 = input->global_state;
  this_03 = (AsOfLocalSourceState *)input->local_state;
  pp_Var5 = pGVar4[1]._vptr_GlobalSourceState;
  context_00 = context->client;
  context_01 = context;
  bVar12 = AsOfLocalSourceState::CombineLeftPartitions(this_03);
  if ((bVar12) && (bVar12 = AsOfLocalSourceState::MergeLeftPartitions(this_03), bVar12)) {
    pPVar13 = unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
              ::operator*((unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
                           *)(pGVar4[1]._vptr_GlobalSourceState + 0x32));
    if ((pPVar13->grouping_data).
        super_unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RadixPartitionedTupleData_*,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
        .super__Head_base<0UL,_duckdb::RadixPartitionedTupleData_*,_false>._M_head_impl ==
        (RadixPartitionedTupleData *)0x0) {
      pEVar24 = (ExecutionContext *)&DAT_00000001;
    }
    else {
      this_04 = unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>,_true>
                ::operator->(&pPVar13->grouping_data);
      puVar14 = PartitionedTupleData::GetPartitions(&this_04->super_PartitionedTupleData);
      pEVar24 = (ExecutionContext *)
                ((long)(puVar14->
                       super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(puVar14->
                       super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    if ((ExecutionContext *)
        pGVar4[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
        __next < pEVar24) {
      this_02 = &this_03->probe_buffer;
      do {
        if ((this_03->probe_buffer).lhs_scanner.
            super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
            .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl ==
            (PayloadScanner *)0x0) {
          LOCK();
          p_Var1 = &pGVar4[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                    __list;
          context_01 = (ExecutionContext *)p_Var1->__prev;
          p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + 1);
          UNLOCK();
          if (context_01 < pEVar24) {
            AsOfProbeBuffer::BeginLeftScan(this_02,(hash_t)context_01);
            goto LAB_01697cd4;
          }
          bVar12 = IsRightOuterJoin((this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                                    super_CachingPhysicalOperator.field_0x81);
          if ((!bVar12) || (((context_00->interrupted)._M_base._M_i & 1U) != 0)) {
            return FINISHED;
          }
          TaskScheduler::GetScheduler(context_00);
          TaskScheduler::YieldThread();
        }
        else {
LAB_01697cd4:
          AsOfProbeBuffer::GetData(this_02,context_01,chunk);
          if (chunk->count != 0) {
            return HAVE_MORE_OUTPUT;
          }
          bVar12 = AsOfProbeBuffer::HasMoreData(this_02);
          if (!bVar12) {
            AsOfProbeBuffer::EndLeftScan(this_02);
            LOCK();
            pp_Var2 = &pGVar4[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                       __data.__list.__next;
            *pp_Var2 = (__pthread_internal_list *)((long)&(*pp_Var2)->__prev + 1);
            UNLOCK();
          }
        }
      } while ((ExecutionContext *)
               pGVar4[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
               __list.__next < pEVar24);
    }
    bVar12 = IsRightOuterJoin((this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                              super_CachingPhysicalOperator.field_0x81);
    if (bVar12) {
      p_Var6 = pp_Var5[0x22];
      p_Var7 = pp_Var5[0x21];
      DataChunk::DataChunk(&local_70);
      allocator = Allocator::Get(context->client);
      DataChunk::Initialize
                (&local_70,allocator,(vector<duckdb::LogicalType,_true> *)(pp_Var5 + 0x1e),0x800);
      SelectionVector::SelectionVector(&local_88,0x800);
      this_00 = &this_03->scanner;
      this_01 = &this_03->hash_group;
LAB_01697ddd:
      if (chunk->count == 0) {
        do {
          if (((PayloadScanner *)
              (this_00->
              super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
              .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>)._M_head_impl !=
              (PayloadScanner *)0x0) {
            pPVar15 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                      ::operator->(this_00);
            pRVar16 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                      ::operator->(&pPVar15->scanner);
            if (pRVar16->total_count != pRVar16->total_scanned) goto LAB_01697eb3;
            __ptr.super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl =
                 (this_00->
                 super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
                 .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>;
            (this_00->
            super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>).
            _M_t.
            super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
            .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false> =
                 (_Head_base<0UL,_duckdb::PayloadScanner_*,_false>)0x0;
            if (__ptr.super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl !=
                (PayloadScanner *)0x0) {
              ::std::default_delete<duckdb::PayloadScanner>::operator()
                        ((default_delete<duckdb::PayloadScanner> *)this_00,
                         (PayloadScanner *)
                         __ptr.super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl);
            }
          }
          __ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
               (this_01->
               super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
               .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>;
          (this_01->
          super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> =
               (_Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>)0x0;
          if (__ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl
              != (PartitionGlobalHashGroup *)0x0) {
            ::std::default_delete<duckdb::PartitionGlobalHashGroup>::operator()
                      ((default_delete<duckdb::PartitionGlobalHashGroup> *)this_01,
                       (PartitionGlobalHashGroup *)
                       __ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>.
                       _M_head_impl);
          }
          LOCK();
          pvVar3 = &pGVar4[1].super_StateWithBlockableTasks.blocked_tasks;
          __n_00 = (pvVar3->
                   super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
                   super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (pvVar3->super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
          super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)&((pvVar3->
                          super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                          ).
                          super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
          UNLOCK();
          if ((pointer)((long)p_Var6 - (long)p_Var7 >> 3) <= __n_00) goto LAB_01698034;
          while ((__n_00 < (pointer)((long)pp_Var5[0x22] - (long)pp_Var5[0x21] >> 3) &&
                 (pvVar17 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                            ::operator[]((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                                          *)(pp_Var5 + 0x21),(size_type)__n_00),
                 (pvVar17->
                 super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                 .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl ==
                 (PartitionGlobalHashGroup *)0x0))) {
            LOCK();
            pvVar3 = &pGVar4[1].super_StateWithBlockableTasks.blocked_tasks;
            __n_00 = (pvVar3->
                     super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
                     super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            (pvVar3->super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
            super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)&((pvVar3->
                            super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                            ).
                            super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
            UNLOCK();
          }
          AsOfLocalSourceState::BeginRightScan(this_03,(idx_t)__n_00);
        } while( true );
      }
      goto LAB_01698030;
    }
  }
  return FINISHED;
LAB_01697eb3:
  pPVar15 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
            operator->(this_00);
  pRVar16 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
            ::operator->(&pPVar15->scanner);
  iVar8 = pRVar16->total_scanned;
  pPVar15 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
            operator->(this_00);
  PayloadScanner::Scan(pPVar15,&local_70);
  if (local_70.count == 0) {
LAB_01698034:
    SVar23 = FINISHED;
    goto LAB_01698037;
  }
  pbVar9 = this_03->found_match;
  iVar21 = 0;
  count = 0;
  do {
    if (pbVar9[iVar21 + iVar8] == false) {
      local_88.sel_vector[count] = (sel_t)iVar21;
      count = count + 1;
    }
    iVar21 = iVar21 + 1;
  } while (local_70.count != iVar21);
  if (count != 0) {
    pvVar18 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                        (&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                          super_CachingPhysicalOperator.super_PhysicalOperator.children,0);
    pLVar10 = (pvVar18->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pLVar11 = (pvVar18->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar22 = ((long)pLVar10 - (long)pLVar11 >> 3) * -0x5555555555555555;
    if (pLVar10 != pLVar11) {
      sVar25 = 0;
      do {
        pvVar19 = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar25);
        Vector::SetVectorType(pvVar19,CONSTANT_VECTOR);
        pvVar19 = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar25);
        ConstantVector::SetNull(pvVar19,true);
        sVar25 = sVar25 + 1;
      } while (lVar22 + (ulong)(lVar22 == 0) != sVar25);
    }
    if ((this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pvVar20 = vector<unsigned_long,_true>::operator[](&this->right_projection_map,__n);
        sVar25 = *pvVar20;
        pvVar19 = vector<duckdb::Vector,_true>::operator[](&chunk->data,lVar22 + __n);
        other = vector<duckdb::Vector,_true>::operator[](&local_70.data,sVar25);
        Vector::Slice(pvVar19,other,&local_88,count);
        __n = __n + 1;
      } while (__n < (ulong)((long)(this->right_projection_map).
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->right_projection_map).
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    chunk->count = count;
LAB_01698030:
    SVar23 = HAVE_MORE_OUTPUT;
LAB_01698037:
    if (local_88.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    DataChunk::~DataChunk(&local_70);
    return SVar23;
  }
  goto LAB_01697ddd;
}

Assistant:

SourceResultType PhysicalAsOfJoin::GetData(ExecutionContext &context, DataChunk &chunk,
                                           OperatorSourceInput &input) const {
	auto &gsource = input.global_state.Cast<AsOfGlobalSourceState>();
	auto &lsource = input.local_state.Cast<AsOfLocalSourceState>();
	auto &rhs_sink = gsource.gsink.rhs_sink;
	auto &client = context.client;

	//	Step 1: Combine the partitions
	if (!lsource.CombineLeftPartitions()) {
		return SourceResultType::FINISHED;
	}

	//	Step 2: Sort on all threads
	if (!lsource.MergeLeftPartitions()) {
		return SourceResultType::FINISHED;
	}

	//	Step 3: Join the partitions
	auto &lhs_sink = *gsource.gsink.lhs_sink;
	const auto left_bins = lhs_sink.grouping_data ? lhs_sink.grouping_data->GetPartitions().size() : 1;
	while (gsource.flushed < left_bins) {
		//	Make sure we have something to flush
		if (!lsource.probe_buffer.Scanning()) {
			const auto left_bin = gsource.next_left++;
			if (left_bin < left_bins) {
				//	More to flush
				lsource.probe_buffer.BeginLeftScan(left_bin);
			} else if (!IsRightOuterJoin(join_type) || client.interrupted) {
				return SourceResultType::FINISHED;
			} else {
				//	Wait for all threads to finish
				//	TODO: How to implement a spin wait correctly?
				//	Returning BLOCKED seems to hang the system.
				TaskScheduler::GetScheduler(client).YieldThread();
				continue;
			}
		}

		lsource.probe_buffer.GetData(context, chunk);
		if (chunk.size()) {
			return SourceResultType::HAVE_MORE_OUTPUT;
		} else if (lsource.probe_buffer.HasMoreData()) {
			//	Join the next partition
			continue;
		} else {
			lsource.probe_buffer.EndLeftScan();
			gsource.flushed++;
		}
	}

	//	Step 4: Emit right join matches
	if (!IsRightOuterJoin(join_type)) {
		return SourceResultType::FINISHED;
	}

	auto &hash_groups = rhs_sink.hash_groups;
	const auto right_groups = hash_groups.size();

	DataChunk rhs_chunk;
	rhs_chunk.Initialize(Allocator::Get(context.client), rhs_sink.payload_types);
	SelectionVector rsel(STANDARD_VECTOR_SIZE);

	while (chunk.size() == 0) {
		//	Move to the next bin if we are done.
		while (!lsource.scanner || !lsource.scanner->Remaining()) {
			lsource.scanner.reset();
			lsource.hash_group.reset();
			auto hash_bin = gsource.next_right++;
			if (hash_bin >= right_groups) {
				return SourceResultType::FINISHED;
			}

			for (; hash_bin < hash_groups.size(); hash_bin = gsource.next_right++) {
				if (hash_groups[hash_bin]) {
					break;
				}
			}
			lsource.BeginRightScan(hash_bin);
		}
		const auto rhs_position = lsource.scanner->Scanned();
		lsource.scanner->Scan(rhs_chunk);

		const auto count = rhs_chunk.size();
		if (count == 0) {
			return SourceResultType::FINISHED;
		}

		// figure out which tuples didn't find a match in the RHS
		auto found_match = lsource.found_match;
		idx_t result_count = 0;
		for (idx_t i = 0; i < count; i++) {
			if (!found_match[rhs_position + i]) {
				rsel.set_index(result_count++, i);
			}
		}

		if (result_count > 0) {
			// if there were any tuples that didn't find a match, output them
			const idx_t left_column_count = children[0].get().GetTypes().size();
			for (idx_t col_idx = 0; col_idx < left_column_count; ++col_idx) {
				chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(chunk.data[col_idx], true);
			}
			for (idx_t col_idx = 0; col_idx < right_projection_map.size(); ++col_idx) {
				const auto rhs_idx = right_projection_map[col_idx];
				chunk.data[left_column_count + col_idx].Slice(rhs_chunk.data[rhs_idx], rsel, result_count);
			}
			chunk.SetCardinality(result_count);
			break;
		}
	}

	return chunk.size() > 0 ? SourceResultType::HAVE_MORE_OUTPUT : SourceResultType::FINISHED;
}